

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265_stream.cpp
# Opt level: O1

void h265_read_sps_rbsp(h265_stream_t *h,bs_t *b)

{
  int *piVar1;
  uint8_t **ppuVar2;
  byte bVar3;
  byte *pbVar4;
  h265_sps_t *sps;
  videoinfo_t *pvVar5;
  uint32_t r_2;
  int iVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  uint32_t r_4;
  byte *pbVar10;
  int iVar11;
  long lVar12;
  uint32_t r_1;
  uint uVar13;
  int iVar14;
  int iVar15;
  uint uVar16;
  int iVar17;
  ulong uVar18;
  uint uVar19;
  int iVar20;
  uint32_t r;
  uint uVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  bool bVar25;
  bool bVar26;
  profile_tier_level_t profile_tier_level;
  profile_tier_level_t local_2c0;
  
  local_2c0.sub_layer_level_present_flag.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  local_2c0.sub_layer_level_present_flag.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2c0.sub_layer_profile_present_flag.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  local_2c0.sub_layer_level_present_flag.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2c0.sub_layer_profile_present_flag.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  local_2c0.sub_layer_profile_present_flag.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  uVar21 = 0;
  memset(&local_2c0.sub_layer_profile_space,0,0x210);
  piVar1 = &b->bits_left;
  ppuVar2 = &b->p;
  pbVar10 = b->p;
  pbVar4 = b->end;
  uVar16 = b->bits_left;
  iVar6 = 3;
  do {
    uVar16 = uVar16 - 1;
    *piVar1 = uVar16;
    uVar13 = 0;
    if (pbVar10 < pbVar4) {
      uVar13 = (uint)((*pbVar10 >> (uVar16 & 0x1f) & 1) != 0);
    }
    if (uVar16 == 0) {
      pbVar10 = pbVar10 + 1;
      *ppuVar2 = pbVar10;
      *piVar1 = 8;
      uVar16 = 8;
    }
    uVar21 = uVar21 | uVar13 << ((byte)iVar6 & 0x1f);
    bVar25 = iVar6 != 0;
    iVar6 = iVar6 + -1;
  } while (bVar25);
  uVar16 = *piVar1;
  pbVar10 = *ppuVar2;
  uVar13 = 0;
  iVar6 = 2;
  do {
    uVar16 = uVar16 - 1;
    *piVar1 = uVar16;
    uVar7 = 0;
    if (pbVar10 < pbVar4) {
      uVar7 = (uint)((*pbVar10 >> (uVar16 & 0x1f) & 1) != 0);
    }
    if (uVar16 == 0) {
      pbVar10 = pbVar10 + 1;
      *ppuVar2 = pbVar10;
      *piVar1 = 8;
      uVar16 = 8;
    }
    uVar13 = uVar13 | uVar7 << ((byte)iVar6 & 0x1f);
    bVar25 = iVar6 != 0;
    iVar6 = iVar6 + -1;
  } while (bVar25);
  uVar16 = *piVar1 - 1;
  *piVar1 = uVar16;
  pbVar10 = *ppuVar2;
  if (pbVar10 < pbVar4) {
    bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
  }
  else {
    bVar25 = false;
  }
  if (uVar16 == 0) {
    *ppuVar2 = pbVar10 + 1;
    *piVar1 = 8;
  }
  iVar6 = 0;
  memset(&local_2c0,0,0x290);
  h265_read_ptl(&local_2c0,b,1,uVar13);
  pbVar10 = b->p;
  pbVar4 = b->end;
  uVar16 = b->bits_left;
  uVar7 = 0xffffffff;
  do {
    uVar16 = uVar16 - 1;
    *piVar1 = uVar16;
    bVar26 = true;
    if (pbVar10 < pbVar4) {
      bVar26 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
    }
    if (uVar16 == 0) {
      pbVar10 = pbVar10 + 1;
      *ppuVar2 = pbVar10;
      *piVar1 = 8;
      uVar16 = 8;
    }
    uVar7 = uVar7 + 1;
    iVar6 = iVar6 + -1;
  } while (((bool)(bVar26 & uVar7 < 0x20)) && (pbVar10 < pbVar4));
  iVar11 = 0;
  uVar16 = 0;
  if (iVar6 != -1) {
    iVar8 = -2 - iVar6;
    iVar17 = -3 - iVar6;
    uVar7 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar16 = 0;
    do {
      uVar7 = uVar7 - 1;
      *piVar1 = uVar7;
      uVar19 = 0;
      if (pbVar10 < pbVar4) {
        uVar19 = (uint)((*pbVar10 >> (uVar7 & 0x1f) & 1) != 0);
      }
      if (uVar7 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar7 = 8;
      }
      uVar16 = uVar16 | uVar19 << ((byte)iVar8 & 0x1f);
      iVar17 = iVar17 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar17 != -2);
  }
  uVar7 = 0xffffffff;
  iVar6 = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar16;
  sps = h->sps_table[iVar6];
  h->sps = sps;
  memset(sps,0,0x1ef8);
  sps->sps_video_parameter_set_id = (uint8_t)uVar21;
  sps->sps_max_sub_layers_minus1 = (uint8_t)uVar13;
  sps->sps_temporal_id_nesting_flag = bVar25;
  memcpy(&sps->ptl,&local_2c0,0x290);
  sps->sps_seq_parameter_set_id = iVar6;
  pbVar10 = b->p;
  pbVar4 = b->end;
  uVar16 = b->bits_left;
  do {
    uVar16 = uVar16 - 1;
    *piVar1 = uVar16;
    bVar25 = true;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
    }
    if (uVar16 == 0) {
      pbVar10 = pbVar10 + 1;
      *ppuVar2 = pbVar10;
      *piVar1 = 8;
      uVar16 = 8;
    }
    uVar7 = uVar7 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar25 & uVar7 < 0x20)) && (pbVar10 < pbVar4));
  if (iVar11 == -1) {
    uVar16 = 0;
  }
  else {
    iVar6 = -2 - iVar11;
    iVar8 = -3 - iVar11;
    uVar21 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar16 = 0;
    do {
      uVar21 = uVar21 - 1;
      *piVar1 = uVar21;
      uVar13 = 0;
      if (pbVar10 < pbVar4) {
        uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
      }
      if (uVar21 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar21 = 8;
      }
      uVar16 = uVar16 | uVar13 << ((byte)iVar6 & 0x1f);
      iVar8 = iVar8 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar8 != -2);
  }
  uVar21 = 0xffffffff;
  iVar6 = ~(-1 << (~(byte)iVar11 & 0x1f)) + uVar16;
  sps->chroma_format_idc = iVar6;
  pvVar5 = h->info;
  pvVar5->chroma_format_idc = iVar6;
  if (iVar6 == 3) {
    uVar16 = *piVar1 - 1;
    *piVar1 = uVar16;
    pbVar10 = *ppuVar2;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
    }
    else {
      bVar25 = false;
    }
    if (uVar16 == 0) {
      *ppuVar2 = pbVar10 + 1;
      *piVar1 = 8;
    }
    sps->separate_colour_plane_flag = bVar25;
  }
  uVar16 = *piVar1;
  pbVar10 = *ppuVar2;
  iVar11 = 0;
  do {
    uVar16 = uVar16 - 1;
    *piVar1 = uVar16;
    bVar25 = true;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
    }
    if (uVar16 == 0) {
      pbVar10 = pbVar10 + 1;
      *ppuVar2 = pbVar10;
      *piVar1 = 8;
      uVar16 = 8;
    }
    uVar21 = uVar21 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
  iVar8 = 0;
  uVar16 = 0;
  if (iVar11 != -1) {
    iVar17 = -2 - iVar11;
    iVar20 = -3 - iVar11;
    uVar21 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar16 = 0;
    do {
      uVar21 = uVar21 - 1;
      *piVar1 = uVar21;
      uVar13 = 0;
      if (pbVar10 < pbVar4) {
        uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
      }
      if (uVar21 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar21 = 8;
      }
      uVar16 = uVar16 | uVar13 << ((byte)iVar17 & 0x1f);
      iVar20 = iVar20 + -1;
      iVar17 = iVar17 + -1;
    } while (iVar20 != -2);
  }
  uVar21 = 0xffffffff;
  iVar11 = ~(-1 << (~(byte)iVar11 & 0x1f)) + uVar16;
  sps->pic_width_in_luma_samples = iVar11;
  uVar16 = *piVar1;
  pbVar10 = *ppuVar2;
  do {
    uVar16 = uVar16 - 1;
    *piVar1 = uVar16;
    bVar25 = true;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
    }
    if (uVar16 == 0) {
      pbVar10 = pbVar10 + 1;
      *ppuVar2 = pbVar10;
      *piVar1 = 8;
      uVar16 = 8;
    }
    uVar21 = uVar21 + 1;
    iVar8 = iVar8 + -1;
  } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
  uVar16 = 0;
  uVar21 = 0;
  if (iVar8 != -1) {
    iVar17 = -2 - iVar8;
    iVar20 = -3 - iVar8;
    uVar13 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar21 = 0;
    do {
      uVar13 = uVar13 - 1;
      *piVar1 = uVar13;
      uVar7 = 0;
      if (pbVar10 < pbVar4) {
        uVar7 = (uint)((*pbVar10 >> (uVar13 & 0x1f) & 1) != 0);
      }
      if (uVar13 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar13 = 8;
      }
      uVar21 = uVar21 | uVar7 << ((byte)iVar17 & 0x1f);
      iVar20 = iVar20 + -1;
      iVar17 = iVar17 + -1;
    } while (iVar20 != -2);
  }
  iVar8 = ~(-1 << (~(byte)iVar8 & 0x1f)) + uVar21;
  sps->pic_height_in_luma_samples = iVar8;
  pvVar5->width = iVar11;
  pvVar5->height = iVar8;
  uVar21 = *piVar1 - 1;
  *piVar1 = uVar21;
  pbVar10 = *ppuVar2;
  if (pbVar10 < pbVar4) {
    uVar16 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
  }
  if (uVar21 == 0) {
    *ppuVar2 = pbVar10 + 1;
    *piVar1 = 8;
  }
  sps->conformance_window_flag = uVar16;
  if (uVar16 != 0) {
    uVar16 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar21 = 0xffffffff;
    iVar17 = 0;
    do {
      uVar16 = uVar16 - 1;
      *piVar1 = uVar16;
      bVar25 = true;
      if (pbVar10 < pbVar4) {
        bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
      }
      if (uVar16 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar16 = 8;
      }
      uVar21 = uVar21 + 1;
      iVar17 = iVar17 + -1;
    } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
    iVar20 = 0;
    uVar16 = 0;
    if (iVar17 != -1) {
      iVar9 = -2 - iVar17;
      iVar14 = -3 - iVar17;
      uVar21 = *piVar1;
      pbVar10 = *ppuVar2;
      uVar16 = 0;
      do {
        uVar21 = uVar21 - 1;
        *piVar1 = uVar21;
        uVar13 = 0;
        if (pbVar10 < pbVar4) {
          uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
        }
        if (uVar21 == 0) {
          pbVar10 = pbVar10 + 1;
          *ppuVar2 = pbVar10;
          *piVar1 = 8;
          uVar21 = 8;
        }
        uVar16 = uVar16 | uVar13 << ((byte)iVar9 & 0x1f);
        iVar14 = iVar14 + -1;
        iVar9 = iVar9 + -1;
      } while (iVar14 != -2);
    }
    uVar21 = 0xffffffff;
    iVar17 = ~(-1 << (~(byte)iVar17 & 0x1f)) + uVar16;
    sps->conf_win_left_offset = iVar17;
    uVar16 = *piVar1;
    pbVar10 = *ppuVar2;
    do {
      uVar16 = uVar16 - 1;
      *piVar1 = uVar16;
      bVar25 = true;
      if (pbVar10 < pbVar4) {
        bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
      }
      if (uVar16 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar16 = 8;
      }
      uVar21 = uVar21 + 1;
      iVar20 = iVar20 + -1;
    } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
    iVar9 = 0;
    uVar16 = 0;
    if (iVar20 != -1) {
      iVar14 = -2 - iVar20;
      iVar23 = -3 - iVar20;
      uVar21 = *piVar1;
      pbVar10 = *ppuVar2;
      uVar16 = 0;
      do {
        uVar21 = uVar21 - 1;
        *piVar1 = uVar21;
        uVar13 = 0;
        if (pbVar10 < pbVar4) {
          uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
        }
        if (uVar21 == 0) {
          pbVar10 = pbVar10 + 1;
          *ppuVar2 = pbVar10;
          *piVar1 = 8;
          uVar21 = 8;
        }
        uVar16 = uVar16 | uVar13 << ((byte)iVar14 & 0x1f);
        iVar23 = iVar23 + -1;
        iVar14 = iVar14 + -1;
      } while (iVar23 != -2);
    }
    uVar21 = 0xffffffff;
    iVar20 = ~(-1 << (~(byte)iVar20 & 0x1f)) + uVar16;
    sps->conf_win_right_offset = iVar20;
    uVar16 = *piVar1;
    pbVar10 = *ppuVar2;
    do {
      uVar16 = uVar16 - 1;
      *piVar1 = uVar16;
      bVar25 = true;
      if (pbVar10 < pbVar4) {
        bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
      }
      if (uVar16 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar16 = 8;
      }
      uVar21 = uVar21 + 1;
      iVar9 = iVar9 + -1;
    } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
    iVar14 = 0;
    uVar16 = 0;
    if (iVar9 != -1) {
      iVar23 = -2 - iVar9;
      iVar15 = -3 - iVar9;
      uVar21 = *piVar1;
      pbVar10 = *ppuVar2;
      uVar16 = 0;
      do {
        uVar21 = uVar21 - 1;
        *piVar1 = uVar21;
        uVar13 = 0;
        if (pbVar10 < pbVar4) {
          uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
        }
        if (uVar21 == 0) {
          pbVar10 = pbVar10 + 1;
          *ppuVar2 = pbVar10;
          *piVar1 = 8;
          uVar21 = 8;
        }
        uVar16 = uVar16 | uVar13 << ((byte)iVar23 & 0x1f);
        iVar15 = iVar15 + -1;
        iVar23 = iVar23 + -1;
      } while (iVar15 != -2);
    }
    uVar21 = 0xffffffff;
    iVar9 = ~(-1 << (~(byte)iVar9 & 0x1f)) + uVar16;
    sps->conf_win_top_offset = iVar9;
    uVar16 = *piVar1;
    pbVar10 = *ppuVar2;
    do {
      uVar16 = uVar16 - 1;
      *piVar1 = uVar16;
      bVar25 = true;
      if (pbVar10 < pbVar4) {
        bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
      }
      if (uVar16 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar16 = 8;
      }
      uVar21 = uVar21 + 1;
      iVar14 = iVar14 + -1;
    } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
    if (iVar14 == -1) {
      uVar16 = 0;
    }
    else {
      iVar23 = -2 - iVar14;
      iVar15 = -3 - iVar14;
      uVar21 = *piVar1;
      pbVar10 = *ppuVar2;
      uVar16 = 0;
      do {
        uVar21 = uVar21 - 1;
        *piVar1 = uVar21;
        uVar13 = 0;
        if (pbVar10 < pbVar4) {
          uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
        }
        if (uVar21 == 0) {
          pbVar10 = pbVar10 + 1;
          *ppuVar2 = pbVar10;
          *piVar1 = 8;
          uVar21 = 8;
        }
        uVar16 = uVar16 | uVar13 << ((byte)iVar23 & 0x1f);
        iVar15 = iVar15 + -1;
        iVar23 = iVar23 + -1;
      } while (iVar15 != -2);
    }
    iVar23 = -1;
    iVar15 = ~(-1 << (~(byte)iVar14 & 0x1f)) + uVar16;
    sps->conf_win_bottom_offset = iVar15;
    pvVar5->crop_left = iVar17;
    pvVar5->crop_right = iVar20;
    pvVar5->crop_top = iVar9;
    pvVar5->crop_bottom = iVar15;
    iVar14 = -1;
    if (iVar6 - 1U < 2) {
      iVar14 = -1 - (uint)(sps->separate_colour_plane_flag == '\0');
    }
    if (iVar6 == 1) {
      iVar23 = -1 - (uint)(sps->separate_colour_plane_flag == '\0');
    }
    pvVar5->width = iVar14 * (iVar20 + iVar17) + iVar11;
    pvVar5->height = (iVar15 + iVar9) * iVar23 + iVar8;
  }
  uVar16 = *piVar1;
  pbVar10 = *ppuVar2;
  uVar21 = 0xffffffff;
  iVar6 = 0;
  do {
    uVar16 = uVar16 - 1;
    *piVar1 = uVar16;
    bVar25 = true;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
    }
    if (uVar16 == 0) {
      pbVar10 = pbVar10 + 1;
      *ppuVar2 = pbVar10;
      *piVar1 = 8;
      uVar16 = 8;
    }
    uVar21 = uVar21 + 1;
    iVar6 = iVar6 + -1;
  } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
  iVar11 = 0;
  uVar16 = 0;
  if (iVar6 != -1) {
    iVar8 = -2 - iVar6;
    iVar17 = -3 - iVar6;
    uVar21 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar16 = 0;
    do {
      uVar21 = uVar21 - 1;
      *piVar1 = uVar21;
      uVar13 = 0;
      if (pbVar10 < pbVar4) {
        uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
      }
      if (uVar21 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar21 = 8;
      }
      uVar16 = uVar16 | uVar13 << ((byte)iVar8 & 0x1f);
      iVar17 = iVar17 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar17 != -2);
  }
  uVar21 = 0xffffffff;
  iVar6 = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar16;
  sps->bit_depth_luma_minus8 = iVar6;
  uVar16 = *piVar1;
  pbVar10 = *ppuVar2;
  do {
    uVar16 = uVar16 - 1;
    *piVar1 = uVar16;
    bVar25 = true;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
    }
    if (uVar16 == 0) {
      pbVar10 = pbVar10 + 1;
      *ppuVar2 = pbVar10;
      *piVar1 = 8;
      uVar16 = 8;
    }
    uVar21 = uVar21 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
  iVar8 = 0;
  uVar16 = 0;
  if (iVar11 != -1) {
    iVar17 = -2 - iVar11;
    iVar20 = -3 - iVar11;
    uVar21 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar16 = 0;
    do {
      uVar21 = uVar21 - 1;
      *piVar1 = uVar21;
      uVar13 = 0;
      if (pbVar10 < pbVar4) {
        uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
      }
      if (uVar21 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar21 = 8;
      }
      uVar16 = uVar16 | uVar13 << ((byte)iVar17 & 0x1f);
      iVar20 = iVar20 + -1;
      iVar17 = iVar17 + -1;
    } while (iVar20 != -2);
  }
  uVar21 = 0xffffffff;
  uVar13 = ~(-1 << (~(byte)iVar11 & 0x1f));
  sps->bit_depth_chroma_minus8 = uVar16 + uVar13;
  pvVar5->bit_depth_luma = iVar6 + 8;
  pvVar5->bit_depth_chroma = uVar16 + uVar13 + 8;
  pbVar10 = b->p;
  pbVar4 = b->end;
  uVar16 = b->bits_left;
  do {
    uVar16 = uVar16 - 1;
    *piVar1 = uVar16;
    bVar25 = true;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
    }
    if (uVar16 == 0) {
      pbVar10 = pbVar10 + 1;
      *ppuVar2 = pbVar10;
      *piVar1 = 8;
      uVar16 = 8;
    }
    uVar21 = uVar21 + 1;
    iVar8 = iVar8 + -1;
  } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
  bVar25 = false;
  uVar16 = 0;
  if (iVar8 != -1) {
    iVar6 = -2 - iVar8;
    iVar11 = -3 - iVar8;
    uVar21 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar16 = 0;
    do {
      uVar21 = uVar21 - 1;
      *piVar1 = uVar21;
      uVar13 = 0;
      if (pbVar10 < pbVar4) {
        uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
      }
      if (uVar21 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar21 = 8;
      }
      uVar16 = uVar16 | uVar13 << ((byte)iVar6 & 0x1f);
      iVar11 = iVar11 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar11 != -2);
  }
  sps->log2_max_pic_order_cnt_lsb_minus4 = ~(-1 << (~(byte)iVar8 & 0x1f)) + uVar16;
  uVar16 = *piVar1 - 1;
  *piVar1 = uVar16;
  pbVar10 = *ppuVar2;
  if (pbVar10 < pbVar4) {
    bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
  }
  if (uVar16 == 0) {
    *ppuVar2 = pbVar10 + 1;
    *piVar1 = 8;
  }
  sps->sps_sub_layer_ordering_info_present_flag = bVar25;
  uVar16 = 0;
  if (!bVar25) {
    uVar16 = (uint)sps->sps_max_sub_layers_minus1;
  }
  bVar3 = sps->sps_max_sub_layers_minus1;
  if (uVar16 <= bVar3) {
    pbVar10 = *ppuVar2;
    uVar18 = (ulong)uVar16;
    do {
      uVar21 = *piVar1;
      uVar16 = 0xffffffff;
      iVar6 = -2;
      do {
        iVar11 = iVar6;
        uVar13 = uVar16;
        uVar21 = uVar21 - 1;
        *piVar1 = uVar21;
        bVar25 = true;
        if (pbVar10 < pbVar4) {
          bVar25 = (*pbVar10 >> (uVar21 & 0x1f) & 1) == 0;
        }
        if (uVar21 == 0) {
          pbVar10 = pbVar10 + 1;
          *ppuVar2 = pbVar10;
          *piVar1 = 8;
          uVar21 = 8;
        }
        uVar16 = uVar13 + 1;
      } while (((bool)(bVar25 & uVar16 < 0x20)) && (iVar6 = iVar11 + 1, pbVar10 < pbVar4));
      if (uVar16 == 0) {
        uVar21 = 0;
      }
      else {
        uVar7 = *piVar1;
        uVar21 = 0;
        do {
          uVar7 = uVar7 - 1;
          *piVar1 = uVar7;
          uVar19 = 0;
          if (pbVar10 < pbVar4) {
            uVar19 = (uint)((*pbVar10 >> (uVar7 & 0x1f) & 1) != 0);
          }
          if (uVar7 == 0) {
            pbVar10 = pbVar10 + 1;
            *ppuVar2 = pbVar10;
            *piVar1 = 8;
            uVar7 = 8;
          }
          uVar21 = uVar21 | uVar19 << ((byte)uVar13 & 0x1f);
          uVar13 = uVar13 - 1;
          iVar11 = iVar11 + -1;
        } while (iVar11 != -2);
      }
      sps->sps_max_dec_pic_buffering_minus1[uVar18] = ~(-1 << ((byte)uVar16 & 0x1f)) + uVar21;
      uVar16 = *piVar1;
      uVar21 = 0xffffffff;
      iVar6 = -2;
      do {
        iVar11 = iVar6;
        uVar13 = uVar21;
        uVar16 = uVar16 - 1;
        *piVar1 = uVar16;
        bVar25 = true;
        if (pbVar10 < pbVar4) {
          bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
        }
        if (uVar16 == 0) {
          pbVar10 = pbVar10 + 1;
          *ppuVar2 = pbVar10;
          *piVar1 = 8;
          uVar16 = 8;
        }
        uVar21 = uVar13 + 1;
      } while (((bool)(bVar25 & uVar21 < 0x20)) && (iVar6 = iVar11 + 1, pbVar10 < pbVar4));
      if (uVar21 == 0) {
        uVar16 = 0;
      }
      else {
        uVar7 = *piVar1;
        uVar16 = 0;
        do {
          uVar7 = uVar7 - 1;
          *piVar1 = uVar7;
          uVar19 = 0;
          if (pbVar10 < pbVar4) {
            uVar19 = (uint)((*pbVar10 >> (uVar7 & 0x1f) & 1) != 0);
          }
          if (uVar7 == 0) {
            pbVar10 = pbVar10 + 1;
            *ppuVar2 = pbVar10;
            *piVar1 = 8;
            uVar7 = 8;
          }
          uVar16 = uVar16 | uVar19 << ((byte)uVar13 & 0x1f);
          uVar13 = uVar13 - 1;
          iVar11 = iVar11 + -1;
        } while (iVar11 != -2);
      }
      sps->sps_max_num_reorder_pics[uVar18] = ~(-1 << ((byte)uVar21 & 0x1f)) + uVar16;
      uVar21 = *piVar1;
      uVar16 = 0xffffffff;
      iVar6 = -2;
      do {
        iVar11 = iVar6;
        uVar13 = uVar16;
        uVar21 = uVar21 - 1;
        *piVar1 = uVar21;
        bVar25 = true;
        if (pbVar10 < pbVar4) {
          bVar25 = (*pbVar10 >> (uVar21 & 0x1f) & 1) == 0;
        }
        if (uVar21 == 0) {
          pbVar10 = pbVar10 + 1;
          *ppuVar2 = pbVar10;
          *piVar1 = 8;
          uVar21 = 8;
        }
        uVar16 = uVar13 + 1;
      } while (((bool)(bVar25 & uVar16 < 0x20)) && (iVar6 = iVar11 + 1, pbVar10 < pbVar4));
      if (uVar16 == 0) {
        uVar21 = 0;
      }
      else {
        uVar7 = *piVar1;
        uVar21 = 0;
        do {
          uVar7 = uVar7 - 1;
          *piVar1 = uVar7;
          uVar19 = 0;
          if (pbVar10 < pbVar4) {
            uVar19 = (uint)((*pbVar10 >> (uVar7 & 0x1f) & 1) != 0);
          }
          if (uVar7 == 0) {
            pbVar10 = pbVar10 + 1;
            *ppuVar2 = pbVar10;
            *piVar1 = 8;
            uVar7 = 8;
          }
          uVar21 = uVar21 | uVar19 << ((byte)uVar13 & 0x1f);
          uVar13 = uVar13 - 1;
          iVar11 = iVar11 + -1;
        } while (iVar11 != -2);
      }
      sps->sps_max_latency_increase_plus1[uVar18] = ~(-1 << ((byte)uVar16 & 0x1f)) + uVar21;
      uVar18 = uVar18 + 1;
    } while (uVar18 != (ulong)bVar3 + 1);
  }
  uVar16 = *piVar1;
  pbVar10 = *ppuVar2;
  uVar21 = 0xffffffff;
  iVar6 = 0;
  do {
    uVar16 = uVar16 - 1;
    *piVar1 = uVar16;
    bVar25 = true;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
    }
    if (uVar16 == 0) {
      pbVar10 = pbVar10 + 1;
      *ppuVar2 = pbVar10;
      *piVar1 = 8;
      uVar16 = 8;
    }
    uVar21 = uVar21 + 1;
    iVar6 = iVar6 + -1;
  } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
  iVar11 = 0;
  uVar16 = 0;
  if (iVar6 != -1) {
    iVar8 = -2 - iVar6;
    iVar17 = -3 - iVar6;
    uVar21 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar16 = 0;
    do {
      uVar21 = uVar21 - 1;
      *piVar1 = uVar21;
      uVar13 = 0;
      if (pbVar10 < pbVar4) {
        uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
      }
      if (uVar21 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar21 = 8;
      }
      uVar16 = uVar16 | uVar13 << ((byte)iVar8 & 0x1f);
      iVar17 = iVar17 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar17 != -2);
  }
  uVar21 = 0xffffffff;
  sps->log2_min_luma_coding_block_size_minus3 = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar16;
  uVar16 = *piVar1;
  pbVar10 = *ppuVar2;
  do {
    uVar16 = uVar16 - 1;
    *piVar1 = uVar16;
    bVar25 = true;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
    }
    if (uVar16 == 0) {
      pbVar10 = pbVar10 + 1;
      *ppuVar2 = pbVar10;
      *piVar1 = 8;
      uVar16 = 8;
    }
    uVar21 = uVar21 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
  iVar6 = 0;
  uVar16 = 0;
  if (iVar11 != -1) {
    iVar8 = -2 - iVar11;
    iVar17 = -3 - iVar11;
    uVar21 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar16 = 0;
    do {
      uVar21 = uVar21 - 1;
      *piVar1 = uVar21;
      uVar13 = 0;
      if (pbVar10 < pbVar4) {
        uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
      }
      if (uVar21 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar21 = 8;
      }
      uVar16 = uVar16 | uVar13 << ((byte)iVar8 & 0x1f);
      iVar17 = iVar17 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar17 != -2);
  }
  uVar21 = 0xffffffff;
  sps->log2_diff_max_min_luma_coding_block_size = ~(-1 << (~(byte)iVar11 & 0x1f)) + uVar16;
  uVar16 = *piVar1;
  pbVar10 = *ppuVar2;
  do {
    uVar16 = uVar16 - 1;
    *piVar1 = uVar16;
    bVar25 = true;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
    }
    if (uVar16 == 0) {
      pbVar10 = pbVar10 + 1;
      *ppuVar2 = pbVar10;
      *piVar1 = 8;
      uVar16 = 8;
    }
    uVar21 = uVar21 + 1;
    iVar6 = iVar6 + -1;
  } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
  iVar11 = 0;
  uVar16 = 0;
  if (iVar6 != -1) {
    iVar8 = -2 - iVar6;
    iVar17 = -3 - iVar6;
    uVar21 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar16 = 0;
    do {
      uVar21 = uVar21 - 1;
      *piVar1 = uVar21;
      uVar13 = 0;
      if (pbVar10 < pbVar4) {
        uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
      }
      if (uVar21 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar21 = 8;
      }
      uVar16 = uVar16 | uVar13 << ((byte)iVar8 & 0x1f);
      iVar17 = iVar17 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar17 != -2);
  }
  uVar21 = 0xffffffff;
  sps->log2_min_luma_transform_block_size_minus2 = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar16;
  uVar16 = *piVar1;
  pbVar10 = *ppuVar2;
  do {
    uVar16 = uVar16 - 1;
    *piVar1 = uVar16;
    bVar25 = true;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
    }
    if (uVar16 == 0) {
      pbVar10 = pbVar10 + 1;
      *ppuVar2 = pbVar10;
      *piVar1 = 8;
      uVar16 = 8;
    }
    uVar21 = uVar21 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
  iVar6 = 0;
  uVar16 = 0;
  if (iVar11 != -1) {
    iVar8 = -2 - iVar11;
    iVar17 = -3 - iVar11;
    uVar21 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar16 = 0;
    do {
      uVar21 = uVar21 - 1;
      *piVar1 = uVar21;
      uVar13 = 0;
      if (pbVar10 < pbVar4) {
        uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
      }
      if (uVar21 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar21 = 8;
      }
      uVar16 = uVar16 | uVar13 << ((byte)iVar8 & 0x1f);
      iVar17 = iVar17 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar17 != -2);
  }
  uVar21 = 0xffffffff;
  sps->log2_diff_max_min_luma_transform_block_size = ~(-1 << (~(byte)iVar11 & 0x1f)) + uVar16;
  uVar16 = *piVar1;
  pbVar10 = *ppuVar2;
  do {
    uVar16 = uVar16 - 1;
    *piVar1 = uVar16;
    bVar25 = true;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
    }
    if (uVar16 == 0) {
      pbVar10 = pbVar10 + 1;
      *ppuVar2 = pbVar10;
      *piVar1 = 8;
      uVar16 = 8;
    }
    uVar21 = uVar21 + 1;
    iVar6 = iVar6 + -1;
  } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
  iVar11 = 0;
  uVar16 = 0;
  if (iVar6 != -1) {
    iVar8 = -2 - iVar6;
    iVar17 = -3 - iVar6;
    uVar21 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar16 = 0;
    do {
      uVar21 = uVar21 - 1;
      *piVar1 = uVar21;
      uVar13 = 0;
      if (pbVar10 < pbVar4) {
        uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
      }
      if (uVar21 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar21 = 8;
      }
      uVar16 = uVar16 | uVar13 << ((byte)iVar8 & 0x1f);
      iVar17 = iVar17 + -1;
      iVar8 = iVar8 + -1;
    } while (iVar17 != -2);
  }
  uVar21 = 0xffffffff;
  sps->max_transform_hierarchy_depth_inter = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar16;
  uVar16 = *piVar1;
  pbVar10 = *ppuVar2;
  do {
    uVar16 = uVar16 - 1;
    *piVar1 = uVar16;
    bVar25 = true;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
    }
    if (uVar16 == 0) {
      pbVar10 = pbVar10 + 1;
      *ppuVar2 = pbVar10;
      *piVar1 = 8;
      uVar16 = 8;
    }
    uVar21 = uVar21 + 1;
    iVar11 = iVar11 + -1;
  } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
  bVar25 = false;
  uVar16 = 0;
  if (iVar11 != -1) {
    iVar6 = -2 - iVar11;
    iVar8 = -3 - iVar11;
    uVar21 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar16 = 0;
    do {
      uVar21 = uVar21 - 1;
      *piVar1 = uVar21;
      uVar13 = 0;
      if (pbVar10 < pbVar4) {
        uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
      }
      if (uVar21 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar21 = 8;
      }
      uVar16 = uVar16 | uVar13 << ((byte)iVar6 & 0x1f);
      iVar8 = iVar8 + -1;
      iVar6 = iVar6 + -1;
    } while (iVar8 != -2);
  }
  sps->max_transform_hierarchy_depth_intra = ~(-1 << (~(byte)iVar11 & 0x1f)) + uVar16;
  uVar16 = *piVar1 - 1;
  *piVar1 = uVar16;
  pbVar10 = *ppuVar2;
  if (pbVar10 < pbVar4) {
    bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
  }
  if (uVar16 == 0) {
    *ppuVar2 = pbVar10 + 1;
    *piVar1 = 8;
  }
  sps->scaling_list_enabled_flag = bVar25;
  if (bVar25) {
    uVar21 = b->bits_left - 1;
    b->bits_left = uVar21;
    pbVar10 = b->p;
    uVar16 = 0;
    if (pbVar10 < b->end) {
      uVar16 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
    }
    if (uVar21 == 0) {
      *ppuVar2 = pbVar10 + 1;
      *piVar1 = 8;
    }
    sps->sps_scaling_list_data_present_flag = uVar16;
    if (uVar16 != 0) {
      h265_read_scaling_list(&sps->scaling_list_data,b);
    }
  }
  uVar16 = b->bits_left - 1;
  b->bits_left = uVar16;
  pbVar10 = b->p;
  pbVar4 = b->end;
  if (pbVar10 < pbVar4) {
    bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
  }
  else {
    bVar25 = false;
  }
  if (uVar16 == 0) {
    *ppuVar2 = pbVar10 + 1;
    *piVar1 = 8;
  }
  sps->amp_enabled_flag = bVar25;
  uVar16 = *piVar1 - 1;
  *piVar1 = uVar16;
  pbVar10 = *ppuVar2;
  if (pbVar10 < pbVar4) {
    bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
  }
  else {
    bVar25 = false;
  }
  if (uVar16 == 0) {
    *ppuVar2 = pbVar10 + 1;
    *piVar1 = 8;
  }
  sps->sample_adaptive_offset_enabled_flag = bVar25;
  uVar16 = *piVar1 - 1;
  *piVar1 = uVar16;
  pbVar10 = *ppuVar2;
  bVar25 = false;
  if (pbVar10 < pbVar4) {
    bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
  }
  if (uVar16 == 0) {
    *ppuVar2 = pbVar10 + 1;
    *piVar1 = 8;
  }
  sps->pcm_enabled_flag = bVar25;
  if (bVar25) {
    uVar16 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar21 = 0;
    iVar6 = 3;
    do {
      uVar16 = uVar16 - 1;
      *piVar1 = uVar16;
      uVar13 = 0;
      if (pbVar10 < pbVar4) {
        uVar13 = (uint)((*pbVar10 >> (uVar16 & 0x1f) & 1) != 0);
      }
      if (uVar16 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar16 = 8;
      }
      uVar21 = uVar21 | uVar13 << ((byte)iVar6 & 0x1f);
      bVar25 = iVar6 != 0;
      iVar6 = iVar6 + -1;
    } while (bVar25);
    sps->pcm_sample_bit_depth_luma_minus1 = (uint8_t)uVar21;
    uVar16 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar21 = 0;
    iVar6 = 3;
    do {
      uVar16 = uVar16 - 1;
      *piVar1 = uVar16;
      uVar13 = 0;
      if (pbVar10 < pbVar4) {
        uVar13 = (uint)((*pbVar10 >> (uVar16 & 0x1f) & 1) != 0);
      }
      if (uVar16 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar16 = 8;
      }
      bVar3 = (byte)iVar6 & 0x1f;
      uVar21 = uVar21 | uVar13 << bVar3;
      bVar25 = iVar6 != 0;
      iVar6 = iVar6 + -1;
    } while (bVar25);
    sps->pcm_sample_bit_depth_chroma_minus1 = (uint8_t)uVar21;
    uVar16 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar21 = 0xffffffff;
    iVar6 = 0 << bVar3;
    do {
      uVar16 = uVar16 - 1;
      *piVar1 = uVar16;
      bVar25 = true;
      if (pbVar10 < pbVar4) {
        bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
      }
      if (uVar16 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar16 = 8;
      }
      uVar21 = uVar21 + 1;
      iVar6 = iVar6 + -1;
    } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
    iVar11 = 0;
    uVar16 = 0;
    if (iVar6 != -1) {
      iVar8 = -2 - iVar6;
      iVar17 = -3 - iVar6;
      uVar21 = *piVar1;
      pbVar10 = *ppuVar2;
      uVar16 = 0;
      do {
        uVar21 = uVar21 - 1;
        *piVar1 = uVar21;
        uVar13 = 0;
        if (pbVar10 < pbVar4) {
          uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
        }
        if (uVar21 == 0) {
          pbVar10 = pbVar10 + 1;
          *ppuVar2 = pbVar10;
          *piVar1 = 8;
          uVar21 = 8;
        }
        uVar16 = uVar16 | uVar13 << ((byte)iVar8 & 0x1f);
        iVar17 = iVar17 + -1;
        iVar8 = iVar8 + -1;
      } while (iVar17 != -2);
    }
    uVar21 = 0xffffffff;
    sps->log2_min_pcm_luma_coding_block_size_minus3 = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar16;
    uVar16 = *piVar1;
    pbVar10 = *ppuVar2;
    do {
      uVar16 = uVar16 - 1;
      *piVar1 = uVar16;
      bVar25 = true;
      if (pbVar10 < pbVar4) {
        bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
      }
      if (uVar16 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar16 = 8;
      }
      uVar21 = uVar21 + 1;
      iVar11 = iVar11 + -1;
    } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
    if (iVar11 == -1) {
      uVar16 = 0;
    }
    else {
      iVar6 = -2 - iVar11;
      iVar8 = -3 - iVar11;
      uVar21 = *piVar1;
      pbVar10 = *ppuVar2;
      uVar16 = 0;
      do {
        uVar21 = uVar21 - 1;
        *piVar1 = uVar21;
        uVar13 = 0;
        if (pbVar10 < pbVar4) {
          uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
        }
        if (uVar21 == 0) {
          pbVar10 = pbVar10 + 1;
          *ppuVar2 = pbVar10;
          *piVar1 = 8;
          uVar21 = 8;
        }
        uVar16 = uVar16 | uVar13 << ((byte)iVar6 & 0x1f);
        iVar8 = iVar8 + -1;
        iVar6 = iVar6 + -1;
      } while (iVar8 != -2);
    }
    sps->log2_diff_max_min_pcm_luma_coding_block_size = ~(-1 << (~(byte)iVar11 & 0x1f)) + uVar16;
    uVar16 = *piVar1 - 1;
    *piVar1 = uVar16;
    pbVar10 = *ppuVar2;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
    }
    else {
      bVar25 = false;
    }
    if (uVar16 == 0) {
      *ppuVar2 = pbVar10 + 1;
      *piVar1 = 8;
    }
    sps->pcm_loop_filter_disabled_flag = bVar25;
  }
  uVar16 = *piVar1;
  pbVar10 = *ppuVar2;
  uVar21 = 0xffffffff;
  iVar6 = 0;
  do {
    uVar16 = uVar16 - 1;
    *piVar1 = uVar16;
    bVar25 = true;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
    }
    if (uVar16 == 0) {
      pbVar10 = pbVar10 + 1;
      *ppuVar2 = pbVar10;
      *piVar1 = 8;
      uVar16 = 8;
    }
    uVar21 = uVar21 + 1;
    iVar6 = iVar6 + -1;
  } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
  if (iVar6 == -1) {
    uVar16 = 0;
  }
  else {
    iVar11 = -2 - iVar6;
    iVar8 = -3 - iVar6;
    uVar21 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar16 = 0;
    do {
      uVar21 = uVar21 - 1;
      *piVar1 = uVar21;
      uVar13 = 0;
      if (pbVar10 < pbVar4) {
        uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
      }
      if (uVar21 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar21 = 8;
      }
      uVar16 = uVar16 | uVar13 << ((byte)iVar11 & 0x1f);
      iVar8 = iVar8 + -1;
      iVar11 = iVar11 + -1;
    } while (iVar8 != -2);
  }
  iVar6 = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar16;
  sps->num_short_term_ref_pic_sets = iVar6;
  std::vector<st_ref_pic_set_t,_std::allocator<st_ref_pic_set_t>_>::resize
            (&sps->st_ref_pic_set,(long)iVar6);
  std::vector<referencePictureSets_t,_std::allocator<referencePictureSets_t>_>::resize
            (&sps->m_RPSList,(long)sps->num_short_term_ref_pic_sets);
  if (0 < sps->num_short_term_ref_pic_sets) {
    lVar12 = 0;
    lVar24 = 0;
    lVar22 = 0;
    do {
      h265_read_short_term_ref_pic_set
                (b,sps,(st_ref_pic_set_t *)(*(long *)&sps->st_ref_pic_set + lVar24),
                 (referencePictureSets_t *)(*(long *)&sps->m_RPSList + lVar12),(int)lVar22);
      lVar22 = lVar22 + 1;
      lVar24 = lVar24 + 0xa8;
      lVar12 = lVar12 + 0x224;
    } while (lVar22 < sps->num_short_term_ref_pic_sets);
  }
  uVar16 = b->bits_left - 1;
  b->bits_left = uVar16;
  pbVar10 = b->p;
  pbVar4 = b->end;
  bVar25 = false;
  if (pbVar10 < pbVar4) {
    bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
  }
  if (uVar16 == 0) {
    *ppuVar2 = pbVar10 + 1;
    *piVar1 = 8;
  }
  sps->long_term_ref_pics_present_flag = bVar25;
  if (bVar25) {
    uVar16 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar21 = 0xffffffff;
    iVar6 = 0;
    do {
      uVar16 = uVar16 - 1;
      *piVar1 = uVar16;
      bVar25 = true;
      if (pbVar10 < pbVar4) {
        bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) == 0;
      }
      if (uVar16 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar16 = 8;
      }
      uVar21 = uVar21 + 1;
      iVar6 = iVar6 + -1;
    } while (((bool)(bVar25 & uVar21 < 0x20)) && (pbVar10 < pbVar4));
    if (iVar6 == -1) {
      uVar16 = 0;
    }
    else {
      iVar11 = -2 - iVar6;
      iVar8 = -3 - iVar6;
      uVar21 = *piVar1;
      pbVar10 = *ppuVar2;
      uVar16 = 0;
      do {
        uVar21 = uVar21 - 1;
        *piVar1 = uVar21;
        uVar13 = 0;
        if (pbVar10 < pbVar4) {
          uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
        }
        if (uVar21 == 0) {
          pbVar10 = pbVar10 + 1;
          *ppuVar2 = pbVar10;
          *piVar1 = 8;
          uVar21 = 8;
        }
        uVar16 = uVar16 | uVar13 << ((byte)iVar11 & 0x1f);
        iVar8 = iVar8 + -1;
        iVar11 = iVar11 + -1;
      } while (iVar8 != -2);
    }
    iVar6 = ~(-1 << (~(byte)iVar6 & 0x1f)) + uVar16;
    sps->num_long_term_ref_pics_sps = iVar6;
    std::vector<int,_std::allocator<int>_>::resize(&sps->lt_ref_pic_poc_lsb_sps,(long)iVar6);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (&sps->used_by_curr_pic_lt_sps_flag,(long)sps->num_long_term_ref_pics_sps);
    if (0 < sps->num_long_term_ref_pics_sps) {
      lVar12 = 0;
      do {
        iVar6 = sps->log2_max_pic_order_cnt_lsb_minus4;
        sps->lt_ref_pic_poc_lsb_sps_bytes = iVar6 + 4;
        uVar16 = 0;
        if (-4 < iVar6) {
          pbVar10 = b->p;
          uVar21 = b->bits_left;
          iVar6 = iVar6 + 3;
          uVar16 = 0;
          do {
            uVar21 = uVar21 - 1;
            *piVar1 = uVar21;
            uVar13 = 0;
            if (pbVar10 < b->end) {
              uVar13 = (uint)((*pbVar10 >> (uVar21 & 0x1f) & 1) != 0);
            }
            if (uVar21 == 0) {
              pbVar10 = pbVar10 + 1;
              *ppuVar2 = pbVar10;
              *piVar1 = 8;
              uVar21 = 8;
            }
            uVar16 = uVar16 | uVar13 << ((byte)iVar6 & 0x1f);
            bVar25 = iVar6 != 0;
            iVar6 = iVar6 + -1;
          } while (bVar25);
        }
        (sps->lt_ref_pic_poc_lsb_sps).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_start[lVar12] = uVar16;
        uVar16 = b->bits_left - 1;
        b->bits_left = uVar16;
        pbVar10 = b->p;
        if (pbVar10 < b->end) {
          bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
        }
        else {
          bVar25 = false;
        }
        if (uVar16 == 0) {
          *ppuVar2 = pbVar10 + 1;
          *piVar1 = 8;
        }
        (sps->used_by_curr_pic_lt_sps_flag).
        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start[lVar12] = bVar25;
        lVar12 = lVar12 + 1;
      } while (lVar12 < sps->num_long_term_ref_pics_sps);
    }
  }
  uVar16 = b->bits_left - 1;
  b->bits_left = uVar16;
  pbVar10 = b->p;
  pbVar4 = b->end;
  if (pbVar10 < pbVar4) {
    bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
  }
  else {
    bVar25 = false;
  }
  if (uVar16 == 0) {
    *ppuVar2 = pbVar10 + 1;
    *piVar1 = 8;
  }
  sps->sps_temporal_mvp_enabled_flag = bVar25;
  uVar16 = *piVar1 - 1;
  *piVar1 = uVar16;
  pbVar10 = *ppuVar2;
  if (pbVar10 < pbVar4) {
    bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
  }
  else {
    bVar25 = false;
  }
  if (uVar16 == 0) {
    *ppuVar2 = pbVar10 + 1;
    *piVar1 = 8;
  }
  sps->strong_intra_smoothing_enabled_flag = bVar25;
  uVar16 = *piVar1 - 1;
  *piVar1 = uVar16;
  pbVar10 = *ppuVar2;
  bVar25 = false;
  if (pbVar10 < pbVar4) {
    bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
  }
  if (uVar16 == 0) {
    *ppuVar2 = pbVar10 + 1;
    *piVar1 = 8;
  }
  sps->vui_parameters_present_flag = bVar25;
  if (bVar25) {
    h265_read_vui_parameters(&sps->vui,b,(uint)sps->sps_max_sub_layers_minus1);
    uVar16 = (sps->vui).vui_num_units_in_tick;
    if (uVar16 != 0) {
      h->info->max_framerate = (float)(sps->vui).vui_time_scale / (float)uVar16;
    }
  }
  uVar16 = b->bits_left - 1;
  b->bits_left = uVar16;
  pbVar10 = b->p;
  pbVar4 = b->end;
  bVar25 = false;
  if (pbVar10 < pbVar4) {
    bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
  }
  if (uVar16 == 0) {
    *ppuVar2 = pbVar10 + 1;
    *piVar1 = 8;
  }
  sps->sps_extension_present_flag = bVar25;
  if (bVar25) {
    uVar16 = *piVar1 - 1;
    *piVar1 = uVar16;
    pbVar10 = *ppuVar2;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
    }
    else {
      bVar25 = false;
    }
    if (uVar16 == 0) {
      *ppuVar2 = pbVar10 + 1;
      *piVar1 = 8;
    }
    sps->sps_range_extension_flag = bVar25;
    uVar16 = *piVar1 - 1;
    *piVar1 = uVar16;
    pbVar10 = *ppuVar2;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
    }
    else {
      bVar25 = false;
    }
    if (uVar16 == 0) {
      *ppuVar2 = pbVar10 + 1;
      *piVar1 = 8;
    }
    sps->sps_multilayer_extension_flag = bVar25;
    uVar16 = *piVar1 - 1;
    *piVar1 = uVar16;
    pbVar10 = *ppuVar2;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
    }
    else {
      bVar25 = false;
    }
    if (uVar16 == 0) {
      *ppuVar2 = pbVar10 + 1;
      *piVar1 = 8;
    }
    sps->sps_3d_extension_flag = bVar25;
    uVar16 = *piVar1;
    pbVar10 = *ppuVar2;
    uVar21 = 0;
    iVar6 = 4;
    do {
      uVar16 = uVar16 - 1;
      *piVar1 = uVar16;
      uVar13 = 0;
      if (pbVar10 < pbVar4) {
        uVar13 = (uint)((*pbVar10 >> (uVar16 & 0x1f) & 1) != 0);
      }
      if (uVar16 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        *piVar1 = 8;
        uVar16 = 8;
      }
      uVar21 = uVar21 | uVar13 << ((byte)iVar6 & 0x1f);
      bVar25 = iVar6 != 0;
      iVar6 = iVar6 + -1;
    } while (bVar25);
    sps->sps_extension_5bits = (uint8_t)uVar21;
  }
  if (sps->sps_range_extension_flag != '\0') {
    uVar16 = *piVar1 - 1;
    *piVar1 = uVar16;
    pbVar10 = *ppuVar2;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
    }
    else {
      bVar25 = false;
    }
    if (uVar16 == 0) {
      *ppuVar2 = pbVar10 + 1;
      *piVar1 = 8;
    }
    (sps->sps_range_extension).transform_skip_rotation_enabled_flag = bVar25;
    uVar16 = *piVar1 - 1;
    *piVar1 = uVar16;
    pbVar10 = *ppuVar2;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
    }
    else {
      bVar25 = false;
    }
    if (uVar16 == 0) {
      *ppuVar2 = pbVar10 + 1;
      *piVar1 = 8;
    }
    (sps->sps_range_extension).transform_skip_context_enabled_flag = bVar25;
    uVar16 = *piVar1 - 1;
    *piVar1 = uVar16;
    pbVar10 = *ppuVar2;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
    }
    else {
      bVar25 = false;
    }
    if (uVar16 == 0) {
      *ppuVar2 = pbVar10 + 1;
      *piVar1 = 8;
    }
    (sps->sps_range_extension).implicit_rdpcm_enabled_flag = bVar25;
    uVar16 = *piVar1 - 1;
    *piVar1 = uVar16;
    pbVar10 = *ppuVar2;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
    }
    else {
      bVar25 = false;
    }
    if (uVar16 == 0) {
      *ppuVar2 = pbVar10 + 1;
      *piVar1 = 8;
    }
    (sps->sps_range_extension).explicit_rdpcm_enabled_flag = bVar25;
    uVar16 = *piVar1 - 1;
    *piVar1 = uVar16;
    pbVar10 = *ppuVar2;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
    }
    else {
      bVar25 = false;
    }
    if (uVar16 == 0) {
      *ppuVar2 = pbVar10 + 1;
      *piVar1 = 8;
    }
    (sps->sps_range_extension).extended_precision_processing_flag = bVar25;
    uVar16 = *piVar1 - 1;
    *piVar1 = uVar16;
    pbVar10 = *ppuVar2;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
    }
    else {
      bVar25 = false;
    }
    if (uVar16 == 0) {
      *ppuVar2 = pbVar10 + 1;
      *piVar1 = 8;
    }
    (sps->sps_range_extension).intra_smoothing_disabled_flag = bVar25;
    uVar16 = *piVar1 - 1;
    *piVar1 = uVar16;
    pbVar10 = *ppuVar2;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
    }
    else {
      bVar25 = false;
    }
    if (uVar16 == 0) {
      *ppuVar2 = pbVar10 + 1;
      *piVar1 = 8;
    }
    (sps->sps_range_extension).high_precision_offsets_enabled_flag = bVar25;
    uVar16 = *piVar1 - 1;
    *piVar1 = uVar16;
    pbVar10 = *ppuVar2;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
    }
    else {
      bVar25 = false;
    }
    if (uVar16 == 0) {
      *ppuVar2 = pbVar10 + 1;
      *piVar1 = 8;
    }
    (sps->sps_range_extension).persistent_rice_adaptation_enabled_flag = bVar25;
    uVar16 = *piVar1 - 1;
    *piVar1 = uVar16;
    pbVar10 = *ppuVar2;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
    }
    else {
      bVar25 = false;
    }
    if (uVar16 == 0) {
      *ppuVar2 = pbVar10 + 1;
      *piVar1 = 8;
    }
    (sps->sps_range_extension).cabac_bypass_alignment_enabled_flag = bVar25;
  }
  if (sps->sps_multilayer_extension_flag != '\0') {
    uVar16 = *piVar1 - 1;
    *piVar1 = uVar16;
    pbVar10 = *ppuVar2;
    if (pbVar10 < pbVar4) {
      bVar25 = (*pbVar10 >> (uVar16 & 0x1f) & 1) != 0;
    }
    else {
      bVar25 = false;
    }
    if (uVar16 == 0) {
      *ppuVar2 = pbVar10 + 1;
      *piVar1 = 8;
    }
    sps->inter_view_mv_vert_constraint_flag = bVar25;
  }
  if ((sps->sps_extension_5bits != '\0') && (pbVar10 = *ppuVar2, pbVar10 < pbVar4)) {
    iVar6 = *piVar1;
    do {
      iVar6 = iVar6 + -1;
      if (iVar6 == 0) {
        pbVar10 = pbVar10 + 1;
        *ppuVar2 = pbVar10;
        iVar6 = 8;
      }
    } while (pbVar10 < pbVar4);
    *piVar1 = iVar6;
  }
  h265_read_rbsp_trailing_bits(b);
  profile_tier_level_t::~profile_tier_level_t(&local_2c0);
  return;
}

Assistant:

void  h265_read_sps_rbsp(h265_stream_t* h, bs_t* b)
{
    // NOTE 不能直接赋值给sps，因为还未知是哪一个sps。

    int sps_video_parameter_set_id = 0;
    int sps_max_sub_layers_minus1 = 0;
    int sps_temporal_id_nesting_flag = 0;
    int sps_seq_parameter_set_id = 0;
    profile_tier_level_t profile_tier_level;

    sps_video_parameter_set_id = bs_read_u(b, 4);
    sps_max_sub_layers_minus1 = bs_read_u(b, 3);
    sps_temporal_id_nesting_flag = bs_read_u1(b);

    // profile tier level...
    memset(&profile_tier_level, '\0', sizeof(profile_tier_level_t));

    h265_read_ptl(&profile_tier_level, b, 1, sps_max_sub_layers_minus1);

    sps_seq_parameter_set_id = bs_read_ue(b);
    // 选择正确的sps表
    h->sps = h->sps_table[sps_seq_parameter_set_id];
    h265_sps_t* sps = h->sps;
    memset(sps, 0, sizeof(h265_sps_t));

    sps->sps_video_parameter_set_id   = sps_video_parameter_set_id;
    sps->sps_max_sub_layers_minus1    = sps_max_sub_layers_minus1;
    sps->sps_temporal_id_nesting_flag = sps_temporal_id_nesting_flag;

    memcpy(&(sps->ptl), &profile_tier_level, sizeof(profile_tier_level_t)); // ptl

    sps->sps_seq_parameter_set_id     = sps_seq_parameter_set_id;
    sps->chroma_format_idc     = bs_read_ue(b);
    h->info->chroma_format_idc = sps->chroma_format_idc;
    if (sps->chroma_format_idc == 3)
    {
        sps->separate_colour_plane_flag = bs_read_u1(b);
    }
    sps->pic_width_in_luma_samples  = bs_read_ue(b);
    sps->pic_height_in_luma_samples = bs_read_ue(b);

    h->info->width  = sps->pic_width_in_luma_samples;
    h->info->height = sps->pic_height_in_luma_samples;

    sps->conformance_window_flag    = bs_read_u1(b);
    if (sps->conformance_window_flag)
    {
        sps->conf_win_left_offset   = bs_read_ue(b);
        sps->conf_win_right_offset  = bs_read_ue(b);
        sps->conf_win_top_offset    = bs_read_ue(b);
        sps->conf_win_bottom_offset = bs_read_ue(b);

        // calc width & height again...
        h->info->crop_left = sps->conf_win_left_offset;
        h->info->crop_right = sps->conf_win_right_offset;
        h->info->crop_top = sps->conf_win_top_offset;
        h->info->crop_bottom = sps->conf_win_bottom_offset;

        // 根据Table6-1及7.4.3.2.1重新计算宽、高
        // 注意：手册里加1，实际上不用
        // 参考：https://github.com/mbunkus/mkvtoolnix/issues/1152
        int sub_width_c  = ((1 == sps->chroma_format_idc) || (2 == sps->chroma_format_idc)) && (0 == sps->separate_colour_plane_flag) ? 2 : 1;
        int sub_height_c =  (1 == sps->chroma_format_idc)                                  && (0 == sps->separate_colour_plane_flag) ? 2 : 1;
        h->info->width  -= (sub_width_c*sps->conf_win_right_offset + sub_width_c*sps->conf_win_left_offset);
        h->info->height -= (sub_height_c*sps->conf_win_bottom_offset + sub_height_c*sps->conf_win_top_offset);
    }

    sps->bit_depth_luma_minus8   = bs_read_ue(b);
    sps->bit_depth_chroma_minus8 = bs_read_ue(b);

    // bit depth
    h->info->bit_depth_luma = sps->bit_depth_luma_minus8 + 8;
    h->info->bit_depth_chroma = sps->bit_depth_chroma_minus8 + 8;

    sps->log2_max_pic_order_cnt_lsb_minus4 = bs_read_ue(b);

    sps->sps_sub_layer_ordering_info_present_flag = bs_read_u1(b);
    for (int i = (sps->sps_sub_layer_ordering_info_present_flag ? 0 : sps->sps_max_sub_layers_minus1);
         i <= sps->sps_max_sub_layers_minus1; i++ )
    {
        sps->sps_max_dec_pic_buffering_minus1[i] = bs_read_ue(b);
        sps->sps_max_num_reorder_pics[i]         = bs_read_ue(b);
        sps->sps_max_latency_increase_plus1[i]   = bs_read_ue(b);
    }

    sps->log2_min_luma_coding_block_size_minus3      = bs_read_ue(b);
    sps->log2_diff_max_min_luma_coding_block_size    = bs_read_ue(b);
    sps->log2_min_luma_transform_block_size_minus2   = bs_read_ue(b);
    sps->log2_diff_max_min_luma_transform_block_size = bs_read_ue(b);
    sps->max_transform_hierarchy_depth_inter         = bs_read_ue(b);
    sps->max_transform_hierarchy_depth_intra         = bs_read_ue(b);

    sps->scaling_list_enabled_flag = bs_read_u1(b);
    if (sps->scaling_list_enabled_flag)
    {
        sps->sps_scaling_list_data_present_flag = bs_read_u1(b);
        if (sps->sps_scaling_list_data_present_flag)
        {
            // scaling_list_data()
            h265_read_scaling_list(&(sps->scaling_list_data), b);
        }
    }

    sps->amp_enabled_flag = bs_read_u1(b);
    sps->sample_adaptive_offset_enabled_flag = bs_read_u1(b);
    sps->pcm_enabled_flag = bs_read_u1(b);
    if (sps->pcm_enabled_flag)
    {
        sps->pcm_sample_bit_depth_luma_minus1   = bs_read_u(b, 4);
        sps->pcm_sample_bit_depth_chroma_minus1 = bs_read_u(b, 4);
        sps->log2_min_pcm_luma_coding_block_size_minus3   = bs_read_ue(b);
        sps->log2_diff_max_min_pcm_luma_coding_block_size = bs_read_ue(b);
        sps->pcm_loop_filter_disabled_flag      = bs_read_u1(b);
    }

    sps->num_short_term_ref_pic_sets = bs_read_ue(b);
    // 根据num_short_term_ref_pic_sets创建数组
    sps->st_ref_pic_set.resize(sps->num_short_term_ref_pic_sets);
    sps->m_RPSList.resize(sps->num_short_term_ref_pic_sets); // 确定一共有多少个RPS列表
    referencePictureSets_t* rps = NULL;
    st_ref_pic_set_t* st = NULL;
    for (int i = 0; i < sps->num_short_term_ref_pic_sets; i++)
    {
        st = &sps->st_ref_pic_set[i];
        rps = &sps->m_RPSList[i];
        h265_read_short_term_ref_pic_set(b, sps, st, rps, i);
    }

    sps->long_term_ref_pics_present_flag = bs_read_u1(b);
    if (sps->long_term_ref_pics_present_flag)
    {
        sps->num_long_term_ref_pics_sps = bs_read_ue(b);
        sps->lt_ref_pic_poc_lsb_sps.resize(sps->num_long_term_ref_pics_sps);
        sps->used_by_curr_pic_lt_sps_flag.resize(sps->num_long_term_ref_pics_sps);
        for (int i = 0; i < sps->num_long_term_ref_pics_sps; i++)
        {
            sps->lt_ref_pic_poc_lsb_sps_bytes = sps->log2_max_pic_order_cnt_lsb_minus4 + 4;
            sps->lt_ref_pic_poc_lsb_sps[i] = bs_read_u(b, sps->log2_max_pic_order_cnt_lsb_minus4 + 4); // u(v)
            sps->used_by_curr_pic_lt_sps_flag[i] = bs_read_u1(b);
        }
    }

    sps->sps_temporal_mvp_enabled_flag = bs_read_u1(b);
    sps->strong_intra_smoothing_enabled_flag = bs_read_u1(b);
    sps->vui_parameters_present_flag = bs_read_u1(b);
    if (sps->vui_parameters_present_flag)
    {
        h265_read_vui_parameters(&(sps->vui), b, sps->sps_max_sub_layers_minus1);
        // calc fps
        if (sps->vui.vui_num_units_in_tick != 0)
            h->info->max_framerate = (float)(sps->vui.vui_time_scale) / (float)(sps->vui.vui_num_units_in_tick);
    }

    sps->sps_extension_present_flag = bs_read_u1(b);
    if (sps->sps_extension_present_flag)
    {
        sps->sps_range_extension_flag      = bs_read_u1(b);
        sps->sps_multilayer_extension_flag = bs_read_u1(b);
        sps->sps_3d_extension_flag         = bs_read_u1(b);
        sps->sps_extension_5bits           = bs_read_u(b, 5);
    }

    if (sps->sps_range_extension_flag)
    {
        sps->sps_range_extension.transform_skip_rotation_enabled_flag    = bs_read_u1(b);
        sps->sps_range_extension.transform_skip_context_enabled_flag     = bs_read_u1(b);
        sps->sps_range_extension.implicit_rdpcm_enabled_flag             = bs_read_u1(b);
        sps->sps_range_extension.explicit_rdpcm_enabled_flag             = bs_read_u1(b);
        sps->sps_range_extension.extended_precision_processing_flag      = bs_read_u1(b);
        sps->sps_range_extension.intra_smoothing_disabled_flag           = bs_read_u1(b);
        sps->sps_range_extension.high_precision_offsets_enabled_flag     = bs_read_u1(b);
        sps->sps_range_extension.persistent_rice_adaptation_enabled_flag = bs_read_u1(b);
        sps->sps_range_extension.cabac_bypass_alignment_enabled_flag     = bs_read_u1(b);
    }
    if (sps->sps_multilayer_extension_flag)
    {
        // sps_multilayer_extension()
        sps->inter_view_mv_vert_constraint_flag = bs_read_u1(b);
    }
    if (sps->sps_3d_extension_flag)
    {
        // todo sps_3d_extension( )
    }
    if (sps->sps_extension_5bits)
    {
        while (h265_more_rbsp_trailing_data(b))
        {
            int sps_extension_data_flag = bs_read_u1(b);
        }
    }
    h265_read_rbsp_trailing_bits(b);
}